

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parseVolumeBody(FfsParser *this,UModelIndex *index)

{
  TreeModel *pTVar1;
  bool bVar2;
  UINT8 UVar3;
  __type _Var4;
  UINT32 UVar5;
  int32_t iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  UINT8 revision;
  int i;
  uint uVar14;
  FfsParser *this_00;
  char ch;
  ulong uVar15;
  USTATUS UVar16;
  int local_188;
  int local_180;
  UINT32 local_17c;
  UModelIndex current;
  UByteArray freeSpace;
  UByteArray data;
  UModelIndex fileIndex;
  CBString info_1;
  CBString info;
  CBString local_b0;
  UModelIndex local_98;
  UByteArray volumeBody;
  UModelIndex local_48;
  
  bVar2 = UModelIndex::isValid(index);
  if (!bVar2) {
    return 1;
  }
  TreeModel::body(&volumeBody,this->model,index);
  TreeModel::header(&data,this->model,index);
  iVar8 = (int)data.d._M_string_length;
  std::__cxx11::string::~string((string *)&data);
  UVar3 = TreeModel::subtype(this->model,index);
  if (UVar3 != 'q') {
    UVar3 = TreeModel::subtype(this->model,index);
    if (UVar3 != 'r') {
      this_00 = (FfsParser *)this->model;
      bVar2 = TreeModel::hasEmptyParsingData((TreeModel *)this_00,index);
      if (bVar2) {
        UVar3 = '\x02';
        ch = -1;
        revision = '\x02';
        local_17c = 0;
      }
      else {
        TreeModel::parsingData(&data,this->model,index);
        this_00 = (FfsParser *)&data;
        ch = data.d._M_dataplus._M_p[0x1a];
        UVar3 = data.d._M_dataplus._M_p[0x19];
        local_17c = *(UINT32 *)(data.d._M_dataplus._M_p + 0x14);
        revision = data.d._M_dataplus._M_p[0x1b];
        std::__cxx11::string::~string((string *)this_00);
        if ((byte)(UVar3 - 4) < 0xfe) {
          usprintf((CBString *)&data,"%s: unknown FFS version %d","parseVolumeBody",UVar3);
          msg(this,(CBString *)&data,index);
          Bstrlib::CBString::~CBString((CBString *)&data);
          goto LAB_00116b00;
        }
      }
      uVar15 = 0;
      do {
        uVar11 = (uint)uVar15;
        uVar14 = (uint)volumeBody.d._M_string_length - uVar11;
        if ((uint)volumeBody.d._M_string_length <= uVar11) break;
        UVar5 = getFileSize(this_00,&volumeBody,uVar11,UVar3,revision);
        if (UVar5 == 0) {
          usprintf((CBString *)&data,"%s: file header parsing failed with invalid size",
                   "parseVolumeBody");
          msg(this,(CBString *)&data,index);
          Bstrlib::CBString::~CBString((CBString *)&data);
          break;
        }
        uVar12 = (volumeBody.d._M_string_length & 0xffffffff) - uVar15;
        if (0x17 < uVar12) {
          uVar12 = 0x18;
        }
        UByteArray::mid(&data,&volumeBody,uVar11,(int32_t)uVar12);
        iVar6 = UByteArray::count(&data,ch);
        if (iVar6 == (int)data.d._M_string_length) {
          UVar5 = iVar8 + uVar11;
          if (((local_17c != 0) && (local_17c == UVar5)) &&
             (bVar2 = TreeModel::hasEmptyParsingData(this->model,index), !bVar2)) {
            TreeModel::parsingData(&freeSpace,this->model,index);
            pcVar10 = UByteArray::data(&freeSpace);
            pcVar10[0x18] = '\x01';
            TreeModel::setParsingData(this->model,index,&freeSpace);
            pTVar1 = this->model;
            TreeModel::text((CBString *)&current,pTVar1,index);
            Bstrlib::CBString::operator+((CBString *)&fileIndex,(CBString *)&current,"UsedSpace ");
            TreeModel::setText(pTVar1,index,(CBString *)&fileIndex);
            Bstrlib::CBString::~CBString((CBString *)&fileIndex);
            Bstrlib::CBString::~CBString((CBString *)&current);
            std::__cxx11::string::~string((string *)&freeSpace);
          }
          UByteArray::mid(&freeSpace,&volumeBody,uVar11,-1);
          uVar14 = UByteArray::count(&freeSpace,ch);
          uVar11 = (uint)freeSpace.d._M_string_length;
          if (uVar14 == uVar11) {
            usprintf(&info,"Full size: %Xh (%u)",(ulong)uVar14,(ulong)uVar14);
            pTVar1 = this->model;
            Bstrlib::CBString::CBString(&info_1,"Volume free space");
            Bstrlib::CBString::CBString(&local_b0);
            fileIndex._0_8_ = &fileIndex.m;
            fileIndex.i = 0;
            fileIndex.m = (TreeModel *)((ulong)fileIndex.m & 0xffffffffffffff00);
            current._0_8_ = &current.m;
            current.i = 0;
            current.m._0_1_ = 0;
            TreeModel::addItem(&local_98,pTVar1,UVar5,'D','\0',&info_1,&local_b0,&info,
                               (UByteArray *)&fileIndex,&freeSpace,(UByteArray *)&current,Movable,
                               index,'\0');
            std::__cxx11::string::~string((string *)&current);
            std::__cxx11::string::~string((string *)&fileIndex);
            Bstrlib::CBString::~CBString(&local_b0);
            Bstrlib::CBString::~CBString(&info_1);
            Bstrlib::CBString::~CBString(&info);
          }
          else {
            for (lVar13 = 0;
                (uVar14 = uVar11, uVar11 != (uint)lVar13 &&
                (uVar14 = (uint)lVar13, freeSpace.d._M_dataplus._M_p[lVar13] == ch));
                lVar13 = lVar13 + 1) {
            }
            uVar7 = uVar14 + 7 & 0xfffffff8;
            uVar11 = uVar7 - 8;
            if (uVar14 == uVar7) {
              uVar11 = uVar14;
            }
            if (uVar11 != 0) {
              UByteArray::left((UByteArray *)&fileIndex,&freeSpace,uVar11);
              usprintf(&info_1,"Full size: %Xh (%u)",fileIndex.i & 0xffffffff);
              pTVar1 = this->model;
              Bstrlib::CBString::CBString(&local_b0,"Volume free space");
              Bstrlib::CBString::CBString((CBString *)&local_98);
              current._0_8_ = &current.m;
              current.i = 0;
              current.m._0_1_ = 0;
              info._vptr_CBString = (_func_int **)&info.super_tagbstring.data;
              info.super_tagbstring.mlen = 0;
              info.super_tagbstring.slen = 0;
              info.super_tagbstring.data._0_1_ = 0;
              TreeModel::addItem(&local_48,pTVar1,UVar5,'D','\0',&local_b0,(CBString *)&local_98,
                                 &info_1,(UByteArray *)&current,(UByteArray *)&fileIndex,
                                 (UByteArray *)&info,Movable,index,'\0');
              std::__cxx11::string::~string((string *)&info);
              std::__cxx11::string::~string((string *)&current);
              Bstrlib::CBString::~CBString((CBString *)&local_98);
              Bstrlib::CBString::~CBString(&local_b0);
              Bstrlib::CBString::~CBString(&info_1);
              std::__cxx11::string::~string((string *)&fileIndex);
            }
            UByteArray::mid((UByteArray *)&fileIndex,&freeSpace,uVar11,-1);
            parseVolumeNonUefiData(this,(UByteArray *)&fileIndex,uVar11 + UVar5,index);
            std::__cxx11::string::~string((string *)&fileIndex);
          }
LAB_00117167:
          std::__cxx11::string::~string((string *)&freeSpace);
          bVar2 = false;
        }
        else {
          if ((uVar14 < 0x18) || (uVar14 < UVar5)) {
            UByteArray::mid(&freeSpace,&volumeBody,uVar11,-1);
            parseVolumeNonUefiData(this,&freeSpace,iVar8 + uVar11,index);
            goto LAB_00117167;
          }
          fileIndex.r = -1;
          fileIndex.c = -1;
          fileIndex.i = 0;
          fileIndex.m = (TreeModel *)0x0;
          UByteArray::mid(&freeSpace,&volumeBody,uVar11,UVar5);
          UVar16 = parseFileHeader(this,&freeSpace,iVar8 + uVar11,index,&fileIndex);
          std::__cxx11::string::~string((string *)&freeSpace);
          if (UVar16 != 0) {
            usprintf((CBString *)&current,"%s: file header parsing failed with error ",
                     "parseVolumeBody");
            errorCodeToUString(&info,UVar16);
            Bstrlib::CBString::operator+((CBString *)&freeSpace,(CBString *)&current,&info);
            msg(this,(CBString *)&freeSpace,index);
            Bstrlib::CBString::~CBString((CBString *)&freeSpace);
            Bstrlib::CBString::~CBString(&info);
            Bstrlib::CBString::~CBString((CBString *)&current);
          }
          uVar15 = (ulong)(uVar11 + UVar5 + 7 & 0xfffffff8);
          bVar2 = true;
        }
        this_00 = (FfsParser *)&data;
        std::__cxx11::string::~string((string *)this_00);
      } while (bVar2);
      local_188 = 1;
      local_180 = 0;
      while( true ) {
        iVar8 = TreeModel::rowCount(this->model,index);
        if (iVar8 <= local_180) break;
        TreeModel::index((TreeModel *)&current,(char *)index->m,local_180);
        UVar3 = TreeModel::type(this->model,&current);
        if ((UVar3 == 'B') && (UVar3 = TreeModel::subtype(this->model,&current), UVar3 != 0xf0)) {
          TreeModel::header((UByteArray *)&freeSpace.d,this->model,&current);
          UByteArray::UByteArray(&data,freeSpace.d._M_dataplus._M_p,0x10);
          std::__cxx11::string::~string((string *)&freeSpace.d);
          for (iVar8 = local_188; iVar9 = TreeModel::rowCount(this->model,index), iVar8 < iVar9;
              iVar8 = iVar8 + 1) {
            TreeModel::index((TreeModel *)&info,(char *)index->m,iVar8);
            UVar3 = TreeModel::type(this->model,(UModelIndex *)&info);
            if (UVar3 == 'B') {
              TreeModel::header((UByteArray *)&fileIndex,this->model,(UModelIndex *)&info);
              UByteArray::UByteArray((UByteArray *)&freeSpace.d,(char *)fileIndex._0_8_,0x10);
              std::__cxx11::string::~string((string *)&fileIndex);
              _Var4 = std::operator==(&data.d,&freeSpace.d);
              if (_Var4) {
                usprintf(&info_1,"%s: file with duplicate GUID ","parseVolumeBody");
                pcVar10 = UByteArray::data((UByteArray *)&freeSpace.d);
                local_98._0_8_ = *(undefined8 *)pcVar10;
                local_98.i = *(uint64_t *)(pcVar10 + 8);
                guidToUString(&local_b0,(EFI_GUID *)&local_98,true);
                Bstrlib::CBString::operator+((CBString *)&fileIndex,&info_1,&local_b0);
                msg(this,(CBString *)&fileIndex,(UModelIndex *)&info);
                Bstrlib::CBString::~CBString((CBString *)&fileIndex);
                Bstrlib::CBString::~CBString(&local_b0);
                Bstrlib::CBString::~CBString(&info_1);
              }
              std::__cxx11::string::~string((string *)&freeSpace.d);
            }
          }
          std::__cxx11::string::~string((string *)&data);
        }
        local_180 = local_180 + 1;
        local_188 = local_188 + 1;
      }
      UVar16 = 0;
      for (iVar8 = 0; iVar9 = TreeModel::rowCount(this->model,index), iVar8 < iVar9;
          iVar8 = iVar8 + 1) {
        TreeModel::index((TreeModel *)&data,(char *)index->m,iVar8);
        UVar3 = TreeModel::type(this->model,(UModelIndex *)&data);
        if (UVar3 != '@') {
          if (UVar3 == 'B') {
            parseFileBody(this,(UModelIndex *)&data);
          }
          else if (UVar3 != 'D') {
            UVar16 = 9;
            break;
          }
        }
      }
      goto LAB_00116b03;
    }
    parseMicrocodeVolumeBody(this,index);
  }
LAB_00116b00:
  UVar16 = 0;
LAB_00116b03:
  std::__cxx11::string::~string((string *)&volumeBody);
  return UVar16;
}

Assistant:

USTATUS FfsParser::parseVolumeBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    // Get volume header size and body
    UByteArray volumeBody = model->body(index);
    UINT32 volumeHeaderSize = (UINT32)model->header(index).size();
    
    // Parse NVRAM volume with a dedicated function
    if (model->subtype(index) == Subtypes::NvramVolume) {
        return nvramParser->parseNvramVolumeBody(index);
    }
    
    // Parse Microcode volume with a dedicated function
    if (model->subtype(index) == Subtypes::MicrocodeVolume) {
        return parseMicrocodeVolumeBody(index);
    }
    
    // Get required values from parsing data
    UINT8 emptyByte = 0xFF;
    UINT8 ffsVersion = 2;
    UINT32 usedSpace = 0;
    UINT8 revision = 2;
    if (model->hasEmptyParsingData(index) == false) {
        UByteArray data = model->parsingData(index);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        emptyByte = pdata->emptyByte;
        ffsVersion = pdata->ffsVersion;
        usedSpace = pdata->usedSpace;
        revision = pdata->revision;
    }
    
    // Check for unknown FFS version
    if (ffsVersion != 2 && ffsVersion != 3) {
        msg(usprintf("%s: unknown FFS version %d", __FUNCTION__, ffsVersion), index);
        return U_SUCCESS;
    }
    
    // Search for and parse all files
    UINT32 volumeBodySize = (UINT32)volumeBody.size();
    UINT32 fileOffset = 0;
    
    while (fileOffset < volumeBodySize) {
        UINT32 fileSize = getFileSize(volumeBody, fileOffset, ffsVersion, revision);
        
        if (fileSize == 0) {
            msg(usprintf("%s: file header parsing failed with invalid size", __FUNCTION__), index);
            break; // Exit from parsing loop
        }
        
        // Check that we are at the empty space
        UByteArray header = volumeBody.mid(fileOffset, (int)std::min(sizeof(EFI_FFS_FILE_HEADER), (size_t)volumeBodySize - fileOffset));
        if (header.count(emptyByte) == header.size()) { //Empty space
            // Check volume usedSpace entry to be valid
            if (usedSpace > 0 && usedSpace == fileOffset + volumeHeaderSize) {
                if (model->hasEmptyParsingData(index) == false) {
                    UByteArray data = model->parsingData(index);
                    VOLUME_PARSING_DATA* pdata = (VOLUME_PARSING_DATA*)data.data();
                    pdata->hasValidUsedSpace = TRUE;
                    model->setParsingData(index, data);
                    model->setText(index, model->text(index) + "UsedSpace ");
                }
            }
            
            // Check free space to be actually free
            UByteArray freeSpace = volumeBody.mid(fileOffset);
            if (freeSpace.count(emptyByte) != freeSpace.size()) {
                // Search for the first non-empty byte
                UINT32 i;
                UINT32 size = (UINT32)freeSpace.size();
                const UINT8* current = (UINT8*)freeSpace.constData();
                for (i = 0; i < size; i++) {
                    if (*current++ != emptyByte) {
                        break; // Exit from parsing loop
                    }
                }
                
                // Align found index to file alignment
                // It must be possible because minimum 16 bytes of empty were found before
                if (i != ALIGN8(i)) {
                    i = ALIGN8(i) - 8;
                }
                
                // Add all bytes before as free space
                if (i > 0) {
                    UByteArray free = freeSpace.left(i);
                    
                    // Get info
                    UString info = usprintf("Full size: %Xh (%u)", (UINT32)free.size(), (UINT32)free.size());
                    
                    // Add free space item
                    model->addItem(volumeHeaderSize + fileOffset, Types::FreeSpace, 0, UString("Volume free space"), UString(), info, UByteArray(), free, UByteArray(), Movable, index);
                }
                
                // Parse non-UEFI data
                parseVolumeNonUefiData(freeSpace.mid(i), volumeHeaderSize + fileOffset + i, index);
            }
            else {
                // Get info
                UString info = usprintf("Full size: %Xh (%u)", (UINT32)freeSpace.size(), (UINT32)freeSpace.size());
                
                // Add free space item
                model->addItem(volumeHeaderSize + fileOffset, Types::FreeSpace, 0, UString("Volume free space"), UString(), info, UByteArray(), freeSpace, UByteArray(), Movable, index);
            }
            
            break; // Exit from parsing loop
        }
        
        // We aren't at the end of empty space
        // Check that the remaining space can still have a file in it
        if (volumeBodySize - fileOffset < sizeof(EFI_FFS_FILE_HEADER) // Remaining space is smaller than the smallest possible file
            || volumeBodySize - fileOffset < fileSize) { // Remaining space is smaller than non-empty file size
            // Parse non-UEFI data
            parseVolumeNonUefiData(volumeBody.mid(fileOffset), volumeHeaderSize + fileOffset, index);
            
            break; // Exit from parsing loop
        }
        
        // Parse current file's header
        UModelIndex fileIndex;
        USTATUS result = parseFileHeader(volumeBody.mid(fileOffset, fileSize), volumeHeaderSize + fileOffset, index, fileIndex);
        if (result) {
            msg(usprintf("%s: file header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
        }
        
        // Move to next file
        fileOffset += fileSize;
        // TODO: check that alignment bytes are all of erase polarity bit, warn if not so
        fileOffset = ALIGN8(fileOffset);
    }
    
    // Check for duplicate GUIDs
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        // Skip non-file entries and padding files
        if (model->type(current) != Types::File
            || model->subtype(current) == EFI_FV_FILETYPE_PAD) {
            continue;
        }
        
        // Get current file GUID
        UByteArray currentGuid(model->header(current).constData(), sizeof(EFI_GUID));
        
        // Check files after current for having an equal GUID
        for (int j = i + 1; j < model->rowCount(index); j++) {
            UModelIndex another = index.model()->index(j, 0, index);
            
            // Skip non-file entries
            if (model->type(another) != Types::File) {
                continue;
            }
            
            // Get another file GUID
            UByteArray anotherGuid(model->header(another).constData(), sizeof(EFI_GUID));
            
            // Check GUIDs for being equal
            if (currentGuid == anotherGuid) {
                msg(usprintf("%s: file with duplicate GUID ", __FUNCTION__) + guidToUString(readUnaligned((EFI_GUID*)(anotherGuid.data()))), another);
            }
        }
    }
    
    // Parse bodies
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::File:
                parseFileBody(current);
                break;
            case Types::Padding:
            case Types::FreeSpace:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}